

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O0

QList<int> * __thiscall
QMainWindowLayoutState::indexOf(QMainWindowLayoutState *this,QWidget *widget)

{
  long lVar1;
  bool bVar2;
  QWidget *dockWidget;
  QDockWidget *pQVar3;
  QDockWidgetGroupWindow *pQVar4;
  QList<int> *in_RDI;
  long in_FS_OFFSET;
  QToolBar *toolBar;
  QList<int> *result;
  undefined4 in_stack_ffffffffffffff78;
  parameter_type in_stack_ffffffffffffff7c;
  QList<int> *this_00;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 uVar5;
  QWidget *in_stack_ffffffffffffffd0;
  QToolBarAreaLayout *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = 0;
  (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  this_00 = in_RDI;
  QList<int>::QList((QList<int> *)0x5f3b3c);
  dockWidget = &qobject_cast<QToolBar*>((QObject *)0x5f3b46)->super_QWidget;
  if (dockWidget == (QWidget *)0x0) {
    pQVar3 = qobject_cast<QDockWidget*>((QObject *)0x5f3bba);
    if ((pQVar3 != (QDockWidget *)0x0) ||
       (pQVar4 = qobject_cast<QDockWidgetGroupWindow*>((QObject *)0x5f3bca),
       pQVar4 != (QDockWidgetGroupWindow *)0x0)) {
      QDockAreaLayout::indexOf
                ((QDockAreaLayout *)CONCAT17(uVar5,in_stack_ffffffffffffffa8),dockWidget);
      QList<int>::operator=
                (this_00,(QList<int> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78)
                );
      QList<int>::~QList((QList<int> *)0x5f3c04);
      bVar2 = QList<int>::isEmpty((QList<int> *)0x5f3c0e);
      if (!bVar2) {
        QList<int>::prepend((QList<int> *)0x5f3c21,in_stack_ffffffffffffff7c);
      }
    }
  }
  else {
    QToolBarAreaLayout::indexOf(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    QList<int>::operator=
              (this_00,(QList<int> *)CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    QList<int>::~QList((QList<int> *)0x5f3b84);
    bVar2 = QList<int>::isEmpty((QList<int> *)0x5f3b8e);
    if (!bVar2) {
      QList<int>::prepend((QList<int> *)0x5f3b9e,in_stack_ffffffffffffff7c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QList<int> QMainWindowLayoutState::indexOf(QWidget *widget) const
{
    QList<int> result;

#if QT_CONFIG(toolbar)
    // is it a toolbar?
    if (QToolBar *toolBar = qobject_cast<QToolBar*>(widget)) {
        result = toolBarAreaLayout.indexOf(toolBar);
        if (!result.isEmpty())
            result.prepend(0);
        return result;
    }
#endif

#if QT_CONFIG(dockwidget)
    // is it a dock widget?
    if (qobject_cast<QDockWidget *>(widget) || qobject_cast<QDockWidgetGroupWindow *>(widget)) {
        result = dockAreaLayout.indexOf(widget);
        if (!result.isEmpty())
            result.prepend(1);
        return result;
    }
#endif // QT_CONFIG(dockwidget)

    return result;
}